

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O1

void rsa_debug(void *ctx,mbedtls_pk_debug_item *items)

{
  items->type = MBEDTLS_PK_DEBUG_MPI;
  items->name = "rsa.N";
  items->value = (void *)((long)ctx + 0x10);
  items[1].type = MBEDTLS_PK_DEBUG_MPI;
  items[1].name = "rsa.E";
  items[1].value = (void *)((long)ctx + 0x28);
  return;
}

Assistant:

static void rsa_debug( const void *ctx, mbedtls_pk_debug_item *items )
{
    items->type = MBEDTLS_PK_DEBUG_MPI;
    items->name = "rsa.N";
    items->value = &( ((mbedtls_rsa_context *) ctx)->N );

    items++;

    items->type = MBEDTLS_PK_DEBUG_MPI;
    items->name = "rsa.E";
    items->value = &( ((mbedtls_rsa_context *) ctx)->E );
}